

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O3

void __thiscall
t_java_generator::generate_java_struct_tuple_writer
          (t_java_generator *this,ostream *out,t_struct *tstruct)

{
  int *piVar1;
  e_req eVar2;
  t_field *ptVar3;
  int iVar4;
  ostream *poVar5;
  undefined4 extraout_var;
  pointer pptVar6;
  pointer pptVar7;
  bool bVar8;
  int iVar9;
  string local_98;
  ostream *local_78;
  string local_70;
  string local_50;
  
  poVar5 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"@Override",9);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar5 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,"public void write(org.apache.thrift.protocol.TProtocol prot, ",0x3d);
  iVar4 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,*(char **)CONCAT44(extraout_var,iVar4),
                      ((undefined8 *)CONCAT44(extraout_var,iVar4))[1]);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5," struct) throws org.apache.thrift.TException {",0x2e);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  poVar5 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,
             "org.apache.thrift.protocol.TTupleProtocol oprot = (org.apache.thrift.protocol.TTupleProtocol) prot;"
             ,99);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  pptVar7 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pptVar7 !=
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    bVar8 = false;
    iVar4 = 0;
    local_78 = out;
    do {
      ptVar3 = *pptVar7;
      eVar2 = ptVar3->req_;
      if (eVar2 - T_OPTIONAL < 2) {
        iVar4 = iVar4 + 1;
        bVar8 = true;
      }
      else if (eVar2 == T_REQUIRED) {
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"struct.","");
        generate_serialize_field(this,local_78,ptVar3,&local_70,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
      }
      out = local_78;
      pptVar7 = pptVar7 + 1;
    } while (pptVar7 !=
             (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
    if (bVar8) {
      poVar5 = t_generator::indent((t_generator *)this,local_78);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"java.util.BitSet optionals = new java.util.BitSet();",0x34);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      pptVar7 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pptVar6 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if (pptVar7 != pptVar6) {
        iVar9 = 0;
        do {
          if ((*pptVar7)->req_ - T_OPTIONAL < 2) {
            poVar5 = t_generator::indent((t_generator *)this,out);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"if (struct.",0xb);
            generate_isset_check_abi_cxx11_(&local_98,this,*pptVar7);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar5,local_98._M_dataplus._M_p,local_98._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,") {",3);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length)
            ;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != &local_98.field_2) {
              operator_delete(local_98._M_dataplus._M_p);
            }
            piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
            *piVar1 = *piVar1 + 1;
            poVar5 = t_generator::indent((t_generator *)this,out);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"optionals.set(",0xe);
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar9);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,");",2);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length)
            ;
            piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
            *piVar1 = *piVar1 + -1;
            poVar5 = t_generator::indent((t_generator *)this,out);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length)
            ;
            iVar9 = iVar9 + 1;
            pptVar6 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          }
          pptVar7 = pptVar7 + 1;
        } while (pptVar7 != pptVar6);
      }
      poVar5 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"oprot.writeBitSet(optionals, ",0x1d);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,");",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      pptVar7 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pptVar6 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if (pptVar7 != pptVar6) {
        do {
          if ((*pptVar7)->req_ - T_OPTIONAL < 2) {
            poVar5 = t_generator::indent((t_generator *)this,out);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"if (struct.",0xb);
            generate_isset_check_abi_cxx11_(&local_98,this,*pptVar7);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar5,local_98._M_dataplus._M_p,local_98._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,") {",3);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length)
            ;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != &local_98.field_2) {
              operator_delete(local_98._M_dataplus._M_p);
            }
            piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
            *piVar1 = *piVar1 + 1;
            ptVar3 = *pptVar7;
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"struct.","");
            generate_serialize_field(this,out,ptVar3,&local_50,false);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p);
            }
            piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
            *piVar1 = *piVar1 + -1;
            poVar5 = t_generator::indent((t_generator *)this,out);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length)
            ;
            pptVar6 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          }
          pptVar7 = pptVar7 + 1;
        } while (pptVar7 != pptVar6);
      }
    }
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar5 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  return;
}

Assistant:

void t_java_generator::generate_java_struct_tuple_writer(ostream& out, t_struct* tstruct) {
  indent(out) << "@Override" << endl;
  indent(out) << "public void write(org.apache.thrift.protocol.TProtocol prot, "
              << tstruct->get_name() << " struct) throws org.apache.thrift.TException {" << endl;
  indent_up();
  indent(out) << "org.apache.thrift.protocol.TTupleProtocol oprot = (org.apache.thrift.protocol.TTupleProtocol) prot;" << endl;

  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;
  bool has_optional = false;
  int optional_count = 0;
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    if ((*f_iter)->get_req() == t_field::T_OPTIONAL
        || (*f_iter)->get_req() == t_field::T_OPT_IN_REQ_OUT) {
      optional_count++;
      has_optional = true;
    }
    if ((*f_iter)->get_req() == t_field::T_REQUIRED) {
      generate_serialize_field(out, (*f_iter), "struct.", false);
    }
  }
  if (has_optional) {
    indent(out) << "java.util.BitSet optionals = new java.util.BitSet();" << endl;
    int i = 0;
    for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
      if ((*f_iter)->get_req() == t_field::T_OPTIONAL
          || (*f_iter)->get_req() == t_field::T_OPT_IN_REQ_OUT) {
        indent(out) << "if (struct." << generate_isset_check((*f_iter)) << ") {" << endl;
        indent_up();
        indent(out) << "optionals.set(" << i << ");" << endl;
        indent_down();
        indent(out) << "}" << endl;
        i++;
      }
    }

    indent(out) << "oprot.writeBitSet(optionals, " << optional_count << ");" << endl;
    int j = 0;
    for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
      if ((*f_iter)->get_req() == t_field::T_OPTIONAL
          || (*f_iter)->get_req() == t_field::T_OPT_IN_REQ_OUT) {
        indent(out) << "if (struct." << generate_isset_check(*f_iter) << ") {" << endl;
        indent_up();
        generate_serialize_field(out, (*f_iter), "struct.", false);
        indent_down();
        indent(out) << "}" << endl;
        j++;
      }
    }
  }
  indent_down();
  indent(out) << "}" << endl;
}